

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

void duckdb_je_free_default(void *ptr)

{
  ulong uVar1;
  uint64_t uVar2;
  size_t __n;
  uint uVar3;
  tsd_t *tsd;
  void **ppvVar4;
  uintptr_t in_RCX;
  cache_bin_t *pcVar5;
  uintptr_t in_R8;
  cache_bin_t *bin;
  tcache_t *ptVar6;
  long *in_FS_OFFSET;
  rtree_metadata_t rVar7;
  te_ctx_t local_78;
  rtree_ctx_t *rtree_ctx_1;
  uintptr_t args_raw [3];
  
  if (ptr == (void *)0x0) {
    return;
  }
  tsd = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
  if ((*(char *)(*in_FS_OFFSET + -0x2758) != '\0') &&
     (tsd = duckdb_je_tsd_fetch_slow(tsd,true), (tsd->state).repr != '\0')) {
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level == '\0') {
      ptVar6 = (tcache_t *)0x0;
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != false) {
        ptVar6 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
      }
    }
    else {
      ptVar6 = (tcache_t *)0x0;
    }
    args_raw[1] = 0;
    args_raw[2] = 0;
    args_raw[0] = (uintptr_t)ptr;
    duckdb_je_hook_invoke_dalloc(hook_dalloc_free,ptr,args_raw);
    rtree_ctx_1 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    rVar7 = rtree_metadata_read((tsdn_t *)tsd,(rtree_t *)rtree_ctx_1,(rtree_ctx_t *)ptr,in_RCX);
    uVar3 = rVar7.szind;
    __n = duckdb_je_sz_index2size_tab[uVar3];
    if (duckdb_je_opt_junk_free == true) {
      switchD_0049f7f1::default(ptr,0x5a,__n);
    }
    if (ptVar6 == (tcache_t *)0x0) {
      arena_dalloc_no_tcache((tsdn_t *)tsd,ptr);
    }
    else if ((rVar7._8_4_ >> 8 & 1) == 0) {
      if ((uVar3 < ptVar6->tcache_slow->tcache_nbins) &&
         (ppvVar4 = ptVar6->bins[uVar3].stack_head, ppvVar4 != (void **)&duckdb_je_disabled_bin)) {
        pcVar5 = ptVar6->bins + uVar3;
        if (ptVar6->bins[uVar3].low_bits_full == (uint16_t)ppvVar4) {
          duckdb_je_tcache_bin_flush_large
                    (tsd,ptVar6,pcVar5,uVar3,
                     (uint)(ptVar6->bins[uVar3].bin_info.ncached_max >>
                           ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
          ppvVar4 = pcVar5->stack_head;
          if (ptVar6->bins[uVar3].low_bits_full != (uint16_t)ppvVar4) goto LAB_00e46b10;
        }
        else {
          pcVar5->stack_head = ppvVar4 + -1;
          ppvVar4[-1] = ptr;
        }
      }
      else {
        rtree_read((rtree_contents_t *)&local_78,(tsdn_t *)tsd,(rtree_t *)rtree_ctx_1,
                   (rtree_ctx_t *)ptr,in_R8);
        duckdb_je_large_dalloc((tsdn_t *)tsd,(edata_t *)CONCAT71(local_78._1_7_,local_78.is_alloc));
      }
    }
    else {
      pcVar5 = ptVar6->bins + uVar3;
      ppvVar4 = pcVar5->stack_head;
      if (ptVar6->bins[uVar3].low_bits_full == (uint16_t)ppvVar4) {
        if (ppvVar4 == (void **)&duckdb_je_disabled_bin) {
          duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
        }
        else {
          duckdb_je_tcache_bin_flush_small
                    (tsd,ptVar6,pcVar5,uVar3,
                     (uint)(ptVar6->bins[uVar3].bin_info.ncached_max >>
                           ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
          ppvVar4 = pcVar5->stack_head;
          if (ptVar6->bins[uVar3].low_bits_full != (uint16_t)ppvVar4) goto LAB_00e46b10;
        }
      }
      else {
LAB_00e46b10:
        pcVar5->stack_head = ppvVar4 + -1;
        ppvVar4[-1] = ptr;
      }
    }
    uVar2 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar2 + __n;
    if (__n < tsd->
              cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
              uVar2) {
      return;
    }
    goto LAB_00e46b6f;
  }
  ptVar6 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
  rVar7 = rtree_metadata_read((tsdn_t *)tsd,
                              (rtree_t *)
                              &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx,
                              (rtree_ctx_t *)ptr,in_RCX);
  uVar3 = rVar7.szind;
  uVar1 = duckdb_je_sz_index2size_tab[uVar3];
  if ((rVar7._8_4_ >> 8 & 1) == 0) {
    if ((uVar3 < ptVar6->tcache_slow->tcache_nbins) &&
       (ppvVar4 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar3].
                  stack_head, ppvVar4 != (void **)&duckdb_je_disabled_bin)) {
      pcVar5 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins + uVar3;
      if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar3].
          low_bits_full == (uint16_t)ppvVar4) {
        duckdb_je_tcache_bin_flush_large
                  (tsd,ptVar6,pcVar5,uVar3,
                   (uint)((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins
                          [uVar3].bin_info.ncached_max >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
        goto LAB_00e46c10;
      }
      goto LAB_00e469dd;
    }
    rtree_read((rtree_contents_t *)&local_78,(tsdn_t *)tsd,
               (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx,
               (rtree_ctx_t *)ptr,in_R8);
    duckdb_je_large_dalloc((tsdn_t *)tsd,(edata_t *)CONCAT71(local_78._1_7_,local_78.is_alloc));
  }
  else {
    pcVar5 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins + uVar3;
    ppvVar4 = pcVar5->stack_head;
    if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar3].
        low_bits_full == (uint16_t)ppvVar4) {
      if (ppvVar4 == (void **)&duckdb_je_disabled_bin) {
        duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
      }
      else {
        duckdb_je_tcache_bin_flush_small
                  (tsd,ptVar6,pcVar5,uVar3,
                   (uint)((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins
                          [uVar3].bin_info.ncached_max >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_00e46c10:
        ppvVar4 = pcVar5->stack_head;
        if (pcVar5->low_bits_full != (uint16_t)ppvVar4) {
          pcVar5->stack_head = ppvVar4 + -1;
          ppvVar4[-1] = ptr;
        }
      }
    }
    else {
LAB_00e469dd:
      pcVar5->stack_head = ppvVar4 + -1;
      ppvVar4[-1] = ptr;
    }
  }
  uVar2 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar2 + uVar1;
  if (uVar1 < tsd->
              cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
              uVar2) {
    return;
  }
LAB_00e46b6f:
  local_78.next_event_fast =
       &tsd->
        cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast;
  local_78.next_event =
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event;
  local_78.last_event =
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event;
  local_78.current = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  local_78.is_alloc = false;
  duckdb_je_te_event_trigger(tsd,&local_78);
  return;
}

Assistant:

JEMALLOC_NOINLINE
void
free_default(void *ptr) {
	UTRACE(ptr, 0, 0);
	if (likely(ptr != NULL)) {
		/*
		 * We avoid setting up tsd fully (e.g. tcache, arena binding)
		 * based on only free() calls -- other activities trigger the
		 * minimal to full transition.  This is because free() may
		 * happen during thread shutdown after tls deallocation: if a
		 * thread never had any malloc activities until then, a
		 * fully-setup tsd won't be destructed properly.
		 */
		tsd_t *tsd = tsd_fetch_min();
		check_entry_exit_locking(tsd_tsdn(tsd));

		if (likely(tsd_fast(tsd))) {
			tcache_t *tcache = tcache_get_from_ind(tsd,
			    TCACHE_IND_AUTOMATIC, /* slow */ false,
			    /* is_alloc */ false);
			ifree(tsd, ptr, tcache, /* slow */ false);
		} else {
			tcache_t *tcache = tcache_get_from_ind(tsd,
			    TCACHE_IND_AUTOMATIC, /* slow */ true,
			    /* is_alloc */ false);
			uintptr_t args_raw[3] = {(uintptr_t)ptr};
			hook_invoke_dalloc(hook_dalloc_free, ptr, args_raw);
			ifree(tsd, ptr, tcache, /* slow */ true);
		}

		check_entry_exit_locking(tsd_tsdn(tsd));
	}
}